

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::(anonymous_namespace)::GridProgram::shadeFragments(GridProgram *this)

{
  GenericVec4 *pGVar1;
  int iVar2;
  FragmentShadingContext *in_RCX;
  uint in_EDX;
  int fragNdx;
  long in_RSI;
  FragmentPacket *packet;
  ulong uVar3;
  ulong uVar4;
  deUint32 dStack_50;
  deUint32 dStack_4c;
  deUint32 dStack_48;
  deUint32 dStack_44;
  long lStack_40;
  ulong uStack_38;
  
  uVar4 = 0;
  uStack_38 = (ulong)in_EDX;
  if ((int)in_EDX < 1) {
    uStack_38 = uVar4;
  }
  lStack_40 = in_RSI;
  for (uVar3 = 0; uVar3 != uStack_38; uVar3 = uVar3 + 1) {
    packet = (FragmentPacket *)(uVar3 * 0x40 + lStack_40);
    for (fragNdx = 0; fragNdx != 4; fragNdx = fragNdx + 1) {
      rr::readTriangleVarying<float>((rr *)&dStack_50,packet,in_RCX,0,fragNdx);
      iVar2 = ((int)uVar4 + fragNdx) * in_RCX->numFragmentOutputs;
      pGVar1 = in_RCX->outputArray;
      pGVar1[iVar2].v.uData[0] = dStack_50;
      pGVar1[iVar2].v.uData[1] = dStack_4c;
      pGVar1[iVar2].v.uData[2] = dStack_48;
      pGVar1[iVar2].v.uData[3] = dStack_44;
    }
    uVar4 = (ulong)((int)uVar4 + 4);
  }
  return;
}

Assistant:

GridProgram::GridProgram (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_offset", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource("#version 310 es\n"
														"in highp vec4 a_position;\n"
														"in highp vec4 a_offset;\n"
														"in highp vec4 a_color;\n"
														"out highp vec4 v_color;\n"
														"void main(void)\n"
														"{\n"
														"	gl_Position = a_position + a_offset;\n"
														"	v_color = a_color;\n"
														"}\n")
							<< sglr::pdec::FragmentSource(
														"#version 310 es\n"
														"layout(location = 0) out highp vec4 dEQP_FragColor;\n"
														"in highp vec4 v_color;\n"
														"void main(void)\n"
														"{\n"
														"	dEQP_FragColor = v_color;\n"
														"}\n"))
{
}